

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_choice.cpp
# Opt level: O1

void Am_Choice_Start_Method_proc
               (Am_Object *inter,Am_Object *object,Am_Object *event_window,Am_Input_Event *ev)

{
  int x;
  int y;
  Am_Input_Char ic_00;
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  Am_Object *command_obj_00;
  Am_Object object_modified;
  Am_Object *inter_00;
  Am_Object *ref_obj;
  Am_Input_Char ic;
  Am_Object command_obj;
  Am_Inter_Location local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  undefined1 local_70 [8];
  undefined1 local_68 [16];
  Am_Object local_58;
  Am_Object local_50;
  Am_Inter_Internal_Method inter_method;
  
  bVar1 = Am_Check_Inter_Abort_Inactive_Object(object,0x15b,inter);
  if (bVar1) {
    inter_method.from_wrapper = (Am_Method_Wrapper *)0x0;
    inter_method.Call = (Am_Inter_Internal_Method_Type *)0x0;
    pAVar2 = Am_Object::Get(&Am_Interactor,0xbe,0);
    Am_Inter_Internal_Method::operator=(&inter_method,pAVar2);
    (*inter_method.Call)(inter,object,event_window,ev);
    command_obj.data = (Am_Object_Data *)0x0;
    x = ev->x;
    y = ev->y;
    ic = ev->input_char;
    pAVar2 = Am_Object::Get(inter,0xc5,0);
    Am_Object::operator=(&command_obj,pAVar2);
    Am_Inter_Call_Both_Method(inter,&command_obj,199,x,y,event_window,&ic,object,&Am_No_Location);
    pAVar2 = Am_Object::Get(inter,0xcb,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
    if (bVar1) {
      inter_00 = &local_50;
      Am_Object::Am_Object(inter_00,&command_obj);
      command_obj_00 = &local_58;
      Am_Object::Am_Object(command_obj_00,object);
      ref_obj = (Am_Object *)(local_68 + 8);
      Am_Object::Am_Object(ref_obj,inter);
      object_modified.data = (Am_Object_Data *)local_68;
      Am_Object::Am_Object((Am_Object *)object_modified.data,event_window);
      Choice_Handle_New_Old
                (inter_00,command_obj_00,ref_obj,x,y,(Am_Object *)object_modified.data,ic);
    }
    else {
      value = Am_Object::operator_cast_to_Am_Wrapper_(object);
      Am_Object::Set(inter,0x16a,value,0);
      Am_Object::Am_Object(&local_78,inter);
      Am_Object::Am_Object(&local_80,&command_obj);
      Am_Object::Am_Object(&local_88,event_window);
      ic_00 = ic;
      object_modified.data = (Am_Object_Data *)local_70;
      Am_Object::Am_Object((Am_Object *)object_modified.data,object);
      Am_Inter_Location::Am_Inter_Location(&local_90,&Am_No_Location);
      inter_00 = &local_78;
      command_obj_00 = &local_80;
      ref_obj = &local_88;
      Am_Call_Final_Do_And_Register
                (inter_00,command_obj_00,x,y,ref_obj,ic_00,object_modified,
                 (Am_Inter_Location_Data *)&local_90,choice_set_impl_command);
      Am_Inter_Location::~Am_Inter_Location(&local_90);
    }
    Am_Object::~Am_Object((Am_Object *)object_modified.data);
    Am_Object::~Am_Object(ref_obj);
    Am_Object::~Am_Object(command_obj_00);
    Am_Object::~Am_Object(inter_00);
    Am_Object::~Am_Object(&command_obj);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Inter_Internal_Method, void, Am_Choice_Start_Method,
                 (Am_Object & inter, Am_Object &object, Am_Object &event_window,
                  Am_Input_Event *ev))
{
  Am_INTER_TRACE_PRINT(inter, "Choice starting over " << object);

  //do this before prototype's method, so won't even change state
  if (!Am_Check_Inter_Abort_Inactive_Object(object, Am_SELECT_INACTIVE, inter))
    return;

  // first, call the prototype's method
  Am_Inter_Internal_Method inter_method;
  inter_method = Am_Interactor.Get(Am_INTER_START_METHOD);
  inter_method.Call(inter, object, event_window, ev);

  Am_Object command_obj;
  int x = ev->x;
  int y = ev->y;
  Am_Input_Char ic = ev->input_char;
  command_obj = inter.Get(Am_COMMAND);

  Am_Inter_Call_Both_Method(inter, command_obj, Am_START_DO_METHOD, x, y,
                            event_window, ic, object, Am_No_Location);

  if ((bool)inter.Get(Am_CONTINUOUS))
    //calls interim_do_method
    Choice_Handle_New_Old(command_obj, object, inter, x, y, event_window, ic);
  else { // not continuous, just call stop
    inter.Set(Am_INTERIM_VALUE, object);
    Am_Call_Final_Do_And_Register(inter, command_obj, x, y, event_window, ic,
                                  object, Am_No_Location,
                                  choice_set_impl_command);
  }
}